

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_entity_sets.cc
# Opt level: O0

CodimMeshDataSet<bool> *
lf::mesh::utils::flagEntitiesOnBoundary
          (CodimMeshDataSet<bool> *__return_storage_ptr__,shared_ptr<const_lf::mesh::Mesh> *mesh_p,
          dim_t codim)

{
  Entity *e;
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  ostream *this;
  undefined4 extraout_var;
  reference ppEVar5;
  uint *puVar6;
  undefined4 extraout_var_00;
  bool *pbVar7;
  Entity *subent;
  iterator __end4;
  iterator __begin4;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range4;
  Entity *edge;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  undefined1 local_2f0 [4];
  dim_t rel_codim;
  undefined1 local_2d9;
  undefined1 local_2d8 [8];
  CodimMeshDataSet<unsigned_int> no_adjacent_cells;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  dim_t local_1c;
  __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_18;
  dim_t codim_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_p_local;
  CodimMeshDataSet<bool> *bd_flags;
  
  local_1c = codim;
  p_Stack_18 = (__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)mesh_p;
  mesh_p_local = (shared_ptr<const_lf::mesh::Mesh> *)__return_storage_ptr__;
  if (codim != 0) {
    peVar4 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh_p);
    uVar2 = (**peVar4->_vptr_Mesh)();
    if (codim <= uVar2) {
      CountNumSuperEntities
                ((CodimMeshDataSet<unsigned_int> *)local_2d8,
                 (shared_ptr<const_lf::mesh::Mesh> *)p_Stack_18,1,1);
      local_2d9 = 0;
      std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
                ((shared_ptr<const_lf::mesh::Mesh> *)local_2f0,
                 (shared_ptr<const_lf::mesh::Mesh> *)p_Stack_18);
      CodimMeshDataSet<bool>::CodimMeshDataSet
                (__return_storage_ptr__,(shared_ptr<const_lf::mesh::Mesh> *)local_2f0,local_1c,false
                );
      std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
                ((shared_ptr<const_lf::mesh::Mesh> *)local_2f0);
      uVar2 = local_1c - 1;
      peVar4 = std::
               __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Stack_18);
      iVar3 = (*peVar4->_vptr_Mesh[2])(peVar4,1);
      __begin2._M_current = (Entity **)CONCAT44(extraout_var,iVar3);
      __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
      edge = (Entity *)
             std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
      while (bVar1 = __gnu_cxx::
                     operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                               (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                         *)&edge), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppEVar5 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                  ::operator*(&__end2);
        e = *ppEVar5;
        puVar6 = CodimMeshDataSet<unsigned_int>::operator()
                           ((CodimMeshDataSet<unsigned_int> *)local_2d8,e);
        if (*puVar6 == 1) {
          iVar3 = (*e->_vptr_Entity[1])(e,(ulong)uVar2);
          __begin4._M_current = (Entity **)CONCAT44(extraout_var_00,iVar3);
          __end4 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              &__begin4);
          subent = (Entity *)
                   std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              &__begin4);
          while (bVar1 = __gnu_cxx::
                         operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                   (&__end4,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                             *)&subent), ((bVar1 ^ 0xffU) & 1) != 0) {
            ppEVar5 = __gnu_cxx::
                      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      ::operator*(&__end4);
            pbVar7 = CodimMeshDataSet<bool>::operator()(__return_storage_ptr__,*ppEVar5);
            *pbVar7 = true;
            __gnu_cxx::
            __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
            ::operator++(&__end4);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&__end2);
      }
      local_2d9 = 1;
      CodimMeshDataSet<unsigned_int>::~CodimMeshDataSet((CodimMeshDataSet<unsigned_int> *)local_2d8)
      ;
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  this = std::operator<<(local_198,"Illegal codim = ");
  std::ostream::operator<<(this,local_1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"(codim > 0) && (codim <= mesh_p->DimMesh())",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/special_entity_sets.cc"
             ,&local_201);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d8,&local_200,0x2b,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/special_entity_sets.cc"
             ,&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"",(allocator<char> *)&no_adjacent_cells.field_0x37);
  lf::base::AssertionFailed(&local_248,&local_270,0x2b,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&no_adjacent_cells.field_0x37);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  abort();
}

Assistant:

CodimMeshDataSet<bool> flagEntitiesOnBoundary(
    const std::shared_ptr<const Mesh>& mesh_p, lf::base::dim_t codim) {
  LF_ASSERT_MSG((codim > 0) && (codim <= mesh_p->DimMesh()),
                "Illegal codim = " << codim);
  // count cells adjacent to entities of co-dimension 1
  CodimMeshDataSet<lf::base::size_type> no_adjacent_cells{
      CountNumSuperEntities(mesh_p, 1, 1)};
  // flag array
  CodimMeshDataSet<bool> bd_flags{mesh_p, codim, false};
  // relative codimension with respect to faces (entities of co-dimension 1)
  const lf::base::dim_t rel_codim = codim - 1;
  // Run through  faces and flag sub-entities
  for (const lf::mesh::Entity* edge : mesh_p->Entities(1)) {
    if (no_adjacent_cells(*edge) == 1) {
      // Boundary face detected!
      // Traverse all sub-entities of a specific relative co-dimension
      for (const lf::mesh::Entity* subent : edge->SubEntities(rel_codim)) {
        bd_flags(*subent) = true;
      }
    }
  }
  return bd_flags;
}